

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O1

void lose_weapon_skill(int n)

{
  char cVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  
  if (0 < n) {
    iVar3 = n + 1;
    do {
      if (u.weapon_slots == 0) {
        lVar2 = (long)u.skills_advanced;
        if (lVar2 != 0) {
          u.skills_advanced = u.skills_advanced + -1;
          cVar1 = u.skill_record[lVar2 + -1];
          uVar4 = (uint)cVar1;
          if (u.weapon_skills[(int)uVar4].skill < '\x02') {
            panic("lose_weapon_skill (%d)",(ulong)uVar4);
          }
          u.weapon_skills[(int)uVar4].skill = u.weapon_skills[(int)uVar4].skill + -1;
          u.weapon_slots = (int)u.weapon_skills[(int)uVar4].skill;
          if (cVar1 != '&' && '\x1d' < cVar1) {
            u.weapon_slots = (int)(char)((u.weapon_slots - (u.weapon_slots + 1 >> 0x1f)) + 1U >> 1);
          }
          goto LAB_002852d4;
        }
      }
      else {
LAB_002852d4:
        u.weapon_slots = u.weapon_slots + -1;
      }
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

void lose_weapon_skill(int n)
{
    int skill;

    while (--n >= 0) {
	/* deduct first from unused slots, then from last placed slot, if any */
	if (u.weapon_slots) {
	    u.weapon_slots--;
	} else if (u.skills_advanced) {
	    skill = u.skill_record[--u.skills_advanced];
	    if (P_SKILL(skill) <= P_UNSKILLED)
		panic("lose_weapon_skill (%d)", skill);
	    P_SKILL(skill)--;	/* drop skill one level */
	    /* Lost skill might have taken more than one slot; refund rest. */
	    u.weapon_slots = slots_required(skill) - 1;
	    /* It might now be possible to advance some other pending
	       skill by using the refunded slots, but giving a message
	       to that effect would seem pretty confusing.... */
	}
    }
}